

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O2

_Bool compare_andnots(roaring_bitmap_t **rnorun,roaring_bitmap_t **rruns,size_t count)

{
  _Bool _Var1;
  roaring_bitmap_t *bitmap1;
  roaring_bitmap_t *bitmap2;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = 1;
  do {
    if (count <= uVar2) {
LAB_00103551:
      return count <= uVar2;
    }
    bitmap1 = roaring_bitmap_andnot(rnorun[uVar2 - 1],rnorun[uVar2]);
    _Var1 = is_andnot_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "no-run andnot incorrect";
LAB_00103516:
      puts(pcVar3);
      goto LAB_00103551;
    }
    bitmap2 = roaring_bitmap_andnot(rruns[uVar2 - 1],rruns[uVar2]);
    _Var1 = is_andnot_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "runs andnots incorrect";
      goto LAB_00103516;
    }
    _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "Andnots don\'t agree! (slow) ";
      goto LAB_00103516;
    }
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "Andnots don\'t agree!";
LAB_00103524:
      puts(pcVar3);
      puts("\n\nbitmap1:");
      roaring_bitmap_printf_describe(bitmap1);
      puts("\n\nbitmap2:");
      roaring_bitmap_printf_describe(bitmap2);
      goto LAB_00103551;
    }
    roaring_bitmap_free(bitmap1);
    roaring_bitmap_free(bitmap2);
    bitmap1 = inplace_andnot(rnorun[uVar2 - 1],rnorun[uVar2]);
    _Var1 = is_andnot_correct(rnorun[uVar2 - 1],rnorun[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] no-run andnot incorrect";
      goto LAB_00103516;
    }
    bitmap2 = inplace_andnot(rruns[uVar2 - 1],rruns[uVar2]);
    _Var1 = is_andnot_correct(rruns[uVar2 - 1],rruns[uVar2]);
    if (!_Var1) {
      pcVar3 = "[inplace] runs andnots incorrect";
      goto LAB_00103516;
    }
    _Var1 = slow_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "[inplace] Andnots don\'t agree! (slow) ";
      goto LAB_00103516;
    }
    _Var1 = roaring_bitmap_equals(bitmap1,bitmap2);
    if (!_Var1) {
      pcVar3 = "[inplace] Andnots don\'t agree!";
      goto LAB_00103524;
    }
    roaring_bitmap_free(bitmap1);
    roaring_bitmap_free(bitmap2);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool compare_andnots(roaring_bitmap_t **rnorun, roaring_bitmap_t **rruns,
                     size_t count) {
    roaring_bitmap_t *tempornorun;
    roaring_bitmap_t *temporruns;
    for (size_t i = 0; i + 1 < count; ++i) {
        tempornorun = roaring_bitmap_andnot(rnorun[i], rnorun[i + 1]);
        if (!is_andnot_correct(rnorun[i], rnorun[i + 1])) {
            printf("no-run andnot incorrect\n");
            return false;
        }
        temporruns = roaring_bitmap_andnot(rruns[i], rruns[i + 1]);
        if (!is_andnot_correct(rruns[i], rruns[i + 1])) {
            printf("runs andnots incorrect\n");
            return false;
        }
        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("Andnots don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("Andnots don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
        tempornorun = inplace_andnot(rnorun[i], rnorun[i + 1]);
        if (!is_andnot_correct(rnorun[i], rnorun[i + 1])) {
            printf("[inplace] no-run andnot incorrect\n");
            return false;
        }
        temporruns = inplace_andnot(rruns[i], rruns[i + 1]);
        if (!is_andnot_correct(rruns[i], rruns[i + 1])) {
            printf("[inplace] runs andnots incorrect\n");
            return false;
        }

        if (!slow_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Andnots don't agree! (slow) \n");
            return false;
        }

        if (!roaring_bitmap_equals(tempornorun, temporruns)) {
            printf("[inplace] Andnots don't agree!\n");
            printf("\n\nbitmap1:\n");
            roaring_bitmap_printf_describe(tempornorun);  // debug
            printf("\n\nbitmap2:\n");
            roaring_bitmap_printf_describe(temporruns);  // debug
            return false;
        }
        roaring_bitmap_free(tempornorun);
        roaring_bitmap_free(temporruns);
    }
    return true;
}